

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

bool __thiscall CKey::VerifyPubKey(CKey *this,CPubKey *pubkey)

{
  long lVar1;
  Span<unsigned_char> bytes;
  bool bVar2;
  allocator<char> *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSig;
  uint256 hash;
  string str;
  uchar rnd [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  size_t in_stack_ffffffffffffff38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  uint256 *in_stack_ffffffffffffff58;
  CPubKey *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  byte bVar4;
  uint32_t in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff98;
  uint256 *in_stack_ffffffffffffffa0;
  CKey *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar3 = in_RDI;
  bVar2 = CPubKey::IsCompressed((CPubKey *)in_stack_ffffffffffffff28);
  if (bVar2 == (bool)(*(byte *)&(in_RDI->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start & 1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),(char *)pvVar3,in_RSI);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
    Span<unsigned_char>::Span<8>
              ((Span<unsigned_char> *)in_stack_ffffffffffffff28,(uchar (*) [8])0xdecdcb);
    bytes.m_data._6_1_ = in_stack_ffffffffffffff36;
    bytes.m_data._0_6_ = in_stack_ffffffffffffff30;
    bytes.m_data._7_1_ = in_stack_ffffffffffffff37;
    bytes.m_size = in_stack_ffffffffffffff38;
    GetRandBytes(bytes);
    Hash<std::__cxx11::string,unsigned_char[8]>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),(uchar (*) [8])pvVar3);
    pvVar3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffff80;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff28);
    Sign(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
         (bool)in_stack_ffffffffffffff97,in_stack_ffffffffffffff90);
    bVar4 = CPubKey::Verify(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_RDI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(pvVar3);
    std::__cxx11::string::~string(in_stack_ffffffffffffff28);
  }
  else {
    bVar4 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar4 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CKey::VerifyPubKey(const CPubKey& pubkey) const {
    if (pubkey.IsCompressed() != fCompressed) {
        return false;
    }
    unsigned char rnd[8];
    std::string str = "Bitcoin key verification\n";
    GetRandBytes(rnd);
    uint256 hash{Hash(str, rnd)};
    std::vector<unsigned char> vchSig;
    Sign(hash, vchSig);
    return pubkey.Verify(hash, vchSig);
}